

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtExternalObject.cpp
# Opt level: O2

void __thiscall JsrtExternalObject::Mark(JsrtExternalObject *this,Recycler *recycler)

{
  Type p_Var1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  undefined1 local_30 [8];
  JsrtCallbackState scope;
  
  Memory::Recycler::SetNeedExternalWrapperTracing(recycler);
  p_Var1 = (this->super_DynamicObject).super_RecyclableObject.type.ptr[1].entryPoint;
  if (p_Var1 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtExternalObject.cpp"
                       ,0xba,"(nullptr != traceCallback)","nullptr != traceCallback");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  JsrtCallbackState::JsrtCallbackState((JsrtCallbackState *)local_30,(ThreadContext *)0x0);
  pRVar5 = (RecyclableObject *)GetSlotData(this);
  (*p_Var1)(pRVar5);
  JsrtCallbackState::~JsrtCallbackState((JsrtCallbackState *)local_30);
  return;
}

Assistant:

void JsrtExternalObject::Mark(Recycler * recycler) 
{
#ifdef _CHAKRACOREBUILD
    recycler->SetNeedExternalWrapperTracing();
    JsTraceCallback traceCallback = this->GetExternalType()->GetJsTraceCallback();
    Assert(nullptr != traceCallback);
    JsrtCallbackState scope(nullptr);
    traceCallback(this->GetSlotData());
#else
    Assert(UNREACHED);
#endif
}